

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Vec_Wec_t * Gia_ManCreateCoSupps(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  undefined8 uVar2;
  void *__ptr;
  int iVar3;
  uint uVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  int *__ptr_00;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  timespec ts;
  long local_58;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    local_58 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_58 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar3 = p->vCos->nSize;
  pVVar5 = (Vec_Wec_t *)malloc(0x10);
  iVar9 = iVar3;
  if (iVar3 - 1U < 7) {
    iVar9 = 8;
  }
  pVVar5->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar5->pArray = pVVar6;
  pVVar5->nSize = iVar3;
  iVar3 = p->nObjs;
  __ptr_00 = (int *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar3 - 1U) {
    iVar9 = iVar3;
  }
  *__ptr_00 = iVar9;
  if (iVar9 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = calloc((long)iVar9,0x10);
  }
  *(void **)(__ptr_00 + 2) = pvVar7;
  __ptr_00[1] = iVar3;
  pVVar6 = p->vCis;
  iVar9 = iVar3;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      iVar1 = pVVar6->pArray[lVar12];
      if (((long)iVar1 < 0) || (iVar9 = p->nObjs, iVar9 <= iVar1)) goto LAB_001f15da;
      if (iVar1 == 0) goto LAB_001f134f;
      if (iVar3 <= iVar1) goto LAB_001f15bb;
      Vec_IntPush((Vec_Int_t *)((long)iVar1 * 0x10 + (long)pvVar7),(int)lVar12);
      lVar12 = lVar12 + 1;
      pVVar6 = p->vCis;
    } while (lVar12 < pVVar6->nSize);
    iVar9 = p->nObjs;
  }
  if (0 < iVar9) {
LAB_001f134f:
    lVar14 = 0;
    lVar12 = 0;
    uVar15 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar2 = *(undefined8 *)(&p->pObjs->field_0x0 + lVar12);
      uVar10 = (uint)uVar2;
      if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
        uVar11 = -(uVar10 & 0x1fffffff) + uVar15;
        iVar3 = (int)uVar11;
        if (iVar3 < 0) goto LAB_001f15bb;
        uVar10 = __ptr_00[1];
        if ((int)uVar10 <= iVar3) goto LAB_001f15bb;
        uVar8 = -((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff) + uVar15;
        uVar4 = (uint)uVar8;
        if ((((int)uVar4 < 0) || (uVar10 <= uVar4)) || (uVar10 <= uVar15)) goto LAB_001f15bb;
        lVar13 = *(long *)(__ptr_00 + 2);
        Vec_IntTwoMerge2((Vec_Int_t *)((uVar11 & 0xffffffff) * 0x10 + lVar13),
                         (Vec_Int_t *)((uVar8 & 0xffffffff) * 0x10 + lVar13),
                         (Vec_Int_t *)(lVar13 + lVar14));
        iVar9 = p->nObjs;
      }
      uVar15 = uVar15 + 1;
      lVar12 = lVar12 + 0xc;
      lVar14 = lVar14 + 0x10;
    } while ((long)uVar15 < (long)iVar9);
  }
  pVVar6 = p->vCos;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      iVar3 = pVVar6->pArray[lVar12];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_001f15da:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (((pVVar5->nSize <= lVar12) ||
          (uVar10 = iVar3 - (*(uint *)(p->pObjs + iVar3) & 0x1fffffff), (int)uVar10 < 0)) ||
         (__ptr_00[1] <= (int)uVar10)) {
LAB_001f15bb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (0 < *(int *)(*(long *)(__ptr_00 + 2) + 4 + (ulong)uVar10 * 0x10)) {
        pVVar6 = pVVar5->pArray;
        lVar14 = *(long *)(__ptr_00 + 2) + (ulong)uVar10 * 0x10;
        lVar13 = 0;
        do {
          Vec_IntPush(pVVar6 + lVar12,*(int *)(*(long *)(lVar14 + 8) + lVar13 * 4));
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)(lVar14 + 4));
        pVVar6 = p->vCos;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar6->nSize);
  }
  iVar3 = *__ptr_00;
  pvVar7 = *(void **)(__ptr_00 + 2);
  if ((long)iVar3 < 1) {
    if (pvVar7 == (void *)0x0) goto LAB_001f150d;
  }
  else {
    lVar12 = 0;
    do {
      __ptr = *(void **)((long)pvVar7 + lVar12 + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)pvVar7 + lVar12 + 8) = 0;
      }
      lVar12 = lVar12 + 0x10;
    } while ((long)iVar3 * 0x10 != lVar12);
  }
  free(pvVar7);
LAB_001f150d:
  free(__ptr_00);
  if (fVerbose != 0) {
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(1,"%s =","Support computation");
    Abc_Print(1,"%9.2f sec\n",(double)(lVar12 + local_58) / 1000000.0);
  }
  return pVVar5;
}

Assistant:

Vec_Wec_t * Gia_ManCreateCoSupps( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSuppsCo = Vec_WecStart( Gia_ManCoNum(p) );
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntAppend( Vec_WecEntry(vSuppsCo, i), Vec_WecEntry(vSupps, Gia_ObjFaninId0p(p, pObj)) );
    Vec_WecFree( vSupps );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSuppsCo;
}